

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImGui::DataTypeFormatString
              (char *buf,int buf_size,ImGuiDataType data_type,void *p_data,char *format)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  if ((data_type & 0xfffffffeU) == 6) {
    iVar1 = ImFormatString(buf,(long)buf_size,format,*p_data);
    return iVar1;
  }
  if ((data_type & 0xfffffffeU) == 4) {
    uVar2 = (ulong)*p_data;
    goto LAB_00135561;
  }
  switch(data_type) {
  case 0:
    uVar2 = (ulong)(uint)(int)*p_data;
    break;
  case 1:
    uVar2 = (ulong)*p_data;
    break;
  case 2:
    uVar2 = (ulong)(uint)(int)*p_data;
    break;
  case 3:
    uVar2 = (ulong)*p_data;
    break;
  default:
    return 0;
  case 8:
    dVar3 = (double)*p_data;
    goto LAB_001355c5;
  case 9:
    dVar3 = *p_data;
LAB_001355c5:
    iVar1 = ImFormatString(buf,(long)buf_size,format,dVar3);
    return iVar1;
  }
LAB_00135561:
  iVar1 = ImFormatString(buf,(long)buf_size,format,uVar2);
  return iVar1;
}

Assistant:

int ImGui::DataTypeFormatString(char* buf, int buf_size, ImGuiDataType data_type, const void* p_data, const char* format)
{
    // Signedness doesn't matter when pushing integer arguments
    if (data_type == ImGuiDataType_S32 || data_type == ImGuiDataType_U32)
        return ImFormatString(buf, buf_size, format, *(const ImU32*)p_data);
    if (data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
        return ImFormatString(buf, buf_size, format, *(const ImU64*)p_data);
    if (data_type == ImGuiDataType_Float)
        return ImFormatString(buf, buf_size, format, *(const float*)p_data);
    if (data_type == ImGuiDataType_Double)
        return ImFormatString(buf, buf_size, format, *(const double*)p_data);
    if (data_type == ImGuiDataType_S8)
        return ImFormatString(buf, buf_size, format, *(const ImS8*)p_data);
    if (data_type == ImGuiDataType_U8)
        return ImFormatString(buf, buf_size, format, *(const ImU8*)p_data);
    if (data_type == ImGuiDataType_S16)
        return ImFormatString(buf, buf_size, format, *(const ImS16*)p_data);
    if (data_type == ImGuiDataType_U16)
        return ImFormatString(buf, buf_size, format, *(const ImU16*)p_data);
    IM_ASSERT(0);
    return 0;
}